

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O3

int I420ToARGB1555(uint8_t *src_y,int src_stride_y,uint8_t *src_u,int src_stride_u,uint8_t *src_v,
                  int src_stride_v,uint8_t *dst_argb1555,int dst_stride_argb1555,int width,
                  int height)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  code *pcVar4;
  int iVar5;
  code *pcVar6;
  undefined1 auVar7 [16];
  
  auVar7._0_4_ = -(uint)(src_y == (uint8_t *)0x0);
  auVar7._4_4_ = -(uint)(src_u == (uint8_t *)0x0);
  auVar7._8_4_ = -(uint)(src_v == (uint8_t *)0x0);
  auVar7._12_4_ = -(uint)(dst_argb1555 == (uint8_t *)0x0);
  iVar5 = movmskps((int)src_u,auVar7);
  iVar1 = -1;
  if ((height != 0 && 0 < width) && iVar5 == 0) {
    uVar2 = height;
    if (height < 0) {
      uVar2 = -height;
      dst_argb1555 = dst_argb1555 + ~height * dst_stride_argb1555;
      dst_stride_argb1555 = -dst_stride_argb1555;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 7U) == 0) {
      pcVar6 = I422ToARGB1555Row_SSSE3;
    }
    else {
      pcVar6 = I422ToARGB1555Row_Any_SSSE3;
    }
    if ((uVar3 & 0x40) == 0) {
      pcVar6 = I422ToARGB1555Row_C;
    }
    uVar3 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar3 = InitCpuFlags();
    }
    if ((width & 0xfU) == 0) {
      pcVar4 = I422ToARGB1555Row_AVX2;
    }
    else {
      pcVar4 = I422ToARGB1555Row_Any_AVX2;
    }
    if ((uVar3 >> 10 & 1) == 0) {
      pcVar4 = pcVar6;
    }
    uVar3 = 0;
    do {
      (*pcVar4)(src_y,src_u,src_v,dst_argb1555,&kYuvI601Constants,width);
      dst_argb1555 = dst_argb1555 + dst_stride_argb1555;
      src_y = src_y + src_stride_y;
      src_u = src_u + (int)(-(uVar3 & 1) & src_stride_u);
      src_v = src_v + (int)(-(uVar3 & 1) & src_stride_v);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBYUV_API
int I420ToARGB1555(const uint8_t* src_y,
                   int src_stride_y,
                   const uint8_t* src_u,
                   int src_stride_u,
                   const uint8_t* src_v,
                   int src_stride_v,
                   uint8_t* dst_argb1555,
                   int dst_stride_argb1555,
                   int width,
                   int height) {
  int y;
  void (*I422ToARGB1555Row)(const uint8_t* y_buf, const uint8_t* u_buf,
                            const uint8_t* v_buf, uint8_t* rgb_buf,
                            const struct YuvConstants* yuvconstants,
                            int width) = I422ToARGB1555Row_C;
  if (!src_y || !src_u || !src_v || !dst_argb1555 || width <= 0 ||
      height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_argb1555 = dst_argb1555 + (height - 1) * dst_stride_argb1555;
    dst_stride_argb1555 = -dst_stride_argb1555;
  }
#if defined(HAS_I422TOARGB1555ROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_SSSE3;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_SSSE3;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_AVX2;
    if (IS_ALIGNED(width, 16)) {
      I422ToARGB1555Row = I422ToARGB1555Row_AVX2;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_NEON;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_MMI;
    if (IS_ALIGNED(width, 4)) {
      I422ToARGB1555Row = I422ToARGB1555Row_MMI;
    }
  }
#endif
#if defined(HAS_I422TOARGB1555ROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    I422ToARGB1555Row = I422ToARGB1555Row_Any_MSA;
    if (IS_ALIGNED(width, 8)) {
      I422ToARGB1555Row = I422ToARGB1555Row_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    I422ToARGB1555Row(src_y, src_u, src_v, dst_argb1555, &kYuvI601Constants,
                      width);
    dst_argb1555 += dst_stride_argb1555;
    src_y += src_stride_y;
    if (y & 1) {
      src_u += src_stride_u;
      src_v += src_stride_v;
    }
  }
  return 0;
}